

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O2

void __thiscall
HMatrix::setup_lgBs(HMatrix *this,int numCol_,int numRow_,int *Astart_,int *Aindex_,double *Avalue_)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  size_type __new_size;
  value_type local_34;
  
  this->numCol = numCol_;
  this->numRow = numRow_;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&this->Astart,Astart_,Astart_ + numCol_ + 1);
  uVar2 = Astart_[numCol_];
  __new_size = (size_type)(int)uVar2;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&this->Aindex,Aindex_,Aindex_ + __new_size);
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->Avalue,Avalue_,Avalue_ + __new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARstart,(long)this->numRow + 1);
  this_00 = &this->AR_Nend;
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(this_00,(long)this->numRow,&local_34);
  piVar4 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  uVar14 = 0;
  if (0 < (int)uVar2) {
    uVar14 = (ulong)uVar2;
  }
  for (; uVar14 != uVar11; uVar11 = uVar11 + 1) {
    piVar1 = piVar5 + piVar4[uVar11];
    *piVar1 = *piVar1 + 1;
  }
  piVar4 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar4 = 0;
  piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar13 = 0;
  for (lVar12 = 1; uVar11 = (ulong)this->numRow, lVar12 <= (long)uVar11; lVar12 = lVar12 + 1) {
    iVar13 = iVar13 + piVar5[lVar12 + -1];
    piVar4[lVar12] = iVar13;
  }
  piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar12 = 0; lVar12 < (int)uVar11; lVar12 = lVar12 + 1) {
    piVar5[lVar12] = piVar4[lVar12];
    uVar11 = (ulong)(uint)this->numRow;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->ARindex,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->ARvalue,__new_size);
  piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = 0;
  while (lVar10 = lVar12, lVar10 < this->numCol) {
    piVar5 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar15 = (long)piVar4[lVar10]; lVar12 = lVar10 + 1, lVar15 < piVar4[lVar10 + 1];
        lVar15 = lVar15 + 1) {
      iVar13 = piVar5[lVar15];
      iVar3 = piVar6[iVar13];
      piVar6[iVar13] = iVar3 + 1;
      piVar7[iVar3] = (int)lVar10;
      pdVar9[iVar3] = pdVar8[lVar15];
    }
  }
  return;
}

Assistant:

void HMatrix::setup_lgBs(int numCol_, int numRow_, const int *Astart_,
			 const int *Aindex_, const double *Avalue_) {
  //Copy the A matrix and setup row-wise matrix with the nonbasic
  //columns before the basic columns for a logical basis
  //
  //Copy A
  numCol = numCol_;
  numRow = numRow_;
  Astart.assign(Astart_, Astart_ + numCol_ + 1);
  
  int AcountX = Astart_[numCol_];
  Aindex.assign(Aindex_, Aindex_ + AcountX);
  Avalue.assign(Avalue_, Avalue_ + AcountX);
  
  // Build row copy - pointers
  ARstart.resize(numRow + 1);
  AR_Nend.assign(numRow, 0);
  for (int k = 0; k < AcountX; k++)
    AR_Nend[Aindex[k]]++;
  ARstart[0] = 0;
  for (int i = 1; i <= numRow; i++)
    ARstart[i] = ARstart[i - 1] + AR_Nend[i - 1];
  for (int i = 0; i < numRow; i++)
    AR_Nend[i] = ARstart[i];
  
  // Build row copy - elements
  ARindex.resize(AcountX);
  ARvalue.resize(AcountX);
  for (int iCol = 0; iCol < numCol; iCol++) {
    for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      int iRow = Aindex[k];
      int iPut = AR_Nend[iRow]++;
      ARindex[iPut] = iCol;
      ARvalue[iPut] = Avalue[k];
    }
  }
}